

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

WebPEncodingError
EncodeImageNoHuffman
          (VP8LBitWriter *bw,uint32_t *argb,VP8LHashChain *hash_chain,VP8LBackwardRefs *refs_array,
          int width,int height,int quality,int low_effort)

{
  int iVar1;
  int iVar2;
  VP8LBitWriter *bw_00;
  VP8LHistogramSet *pVVar3;
  void *pvVar4;
  VP8LBackwardRefs *in_RCX;
  VP8LHistogram *in_RDX;
  HuffmanTreeCode *codes_1;
  HuffmanTreeCode *codes;
  HuffmanTree *huff_tree;
  VP8LHistogramSet *histogram_image;
  int cache_bits;
  uint16_t histogram_symbols [1];
  HuffmanTreeCode huffman_codes [5];
  HuffmanTreeToken *tokens;
  VP8LBackwardRefs *refs;
  WebPEncodingError err;
  int max_tokens;
  int i;
  uint32_t in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffef4;
  uint64_t in_stack_fffffffffffffef8;
  HuffmanTreeCode *huffman_code;
  undefined8 in_stack_ffffffffffffff10;
  HuffmanTreeCode *huffman_code_00;
  HuffmanTree *in_stack_ffffffffffffff18;
  int local_d0;
  undefined1 local_ca [2];
  uint32_t local_c8 [2];
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  VP8LHashChain *in_stack_ffffffffffffff50;
  VP8LBackwardRefs *in_stack_ffffffffffffff58;
  HuffmanTreeCode *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  VP8LHashChain *in_stack_ffffffffffffff88;
  WebPEncodingError local_3c;
  uint32_t local_38;
  int local_34;
  
  local_38 = 0;
  memset(local_c8,0,0x78);
  memset(local_ca,0,2);
  local_d0 = 0;
  iVar2 = 0;
  bw_00 = (VP8LBitWriter *)
          WebPSafeMalloc(in_stack_fffffffffffffef8,
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if (bw_00 == (VP8LBitWriter *)0x0) {
    local_3c = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    iVar1 = VP8LHashChainFill(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                              (uint32_t *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffff6c);
    if (iVar1 == 0) {
      local_3c = VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    else {
      huffman_code = (HuffmanTreeCode *)&local_d0;
      uVar5 = 0;
      iVar1 = local_d0;
      local_3c = VP8LGetBackwardReferences
                           (iVar2,(int)((ulong)bw_00 >> 0x20),
                            &in_stack_ffffffffffffff18->total_count_,
                            (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                            (int)in_stack_ffffffffffffff10,(int)((ulong)huffman_code >> 0x20),
                            in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,
                            in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                            &in_stack_ffffffffffffff60->num_symbols);
      if (local_3c == VP8_ENC_OK) {
        pVVar3 = VP8LAllocateHistogramSet((int)((ulong)huffman_code >> 0x20),(int)huffman_code);
        if (pVVar3 == (VP8LHistogramSet *)0x0) {
          local_3c = VP8_ENC_ERROR_OUT_OF_MEMORY;
        }
        else {
          VP8LHistogramSetClear((VP8LHistogramSet *)in_RCX);
          VP8LHistogramStoreRefs(in_RCX,in_RDX);
          iVar2 = GetHuffBitLengthsAndCodes
                            ((VP8LHistogramSet *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             (HuffmanTreeCode *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          if (iVar2 == 0) {
            local_3c = VP8_ENC_ERROR_OUT_OF_MEMORY;
          }
          else {
            VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffef4,uVar5),
                        in_stack_fffffffffffffeec,iVar1);
            for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
              in_stack_ffffffffffffff18 = (HuffmanTree *)(local_c8 + (long)local_34 * 6);
              if ((int)local_38 < (int)in_stack_ffffffffffffff18->total_count_) {
                local_38 = in_stack_ffffffffffffff18->total_count_;
              }
            }
            pvVar4 = WebPSafeMalloc((uint64_t)in_RDX,CONCAT44(in_stack_fffffffffffffef4,uVar5));
            if (pvVar4 == (void *)0x0) {
              local_3c = VP8_ENC_ERROR_OUT_OF_MEMORY;
            }
            else {
              for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
                huffman_code_00 = (HuffmanTreeCode *)(local_c8 + (long)local_34 * 6);
                StoreHuffmanCode(bw_00,in_stack_ffffffffffffff18,(HuffmanTreeToken *)huffman_code_00
                                 ,huffman_code);
                ClearHuffmanTreeIfOnlyOneSymbol(huffman_code_00);
              }
              local_3c = StoreImageToBitMask((VP8LBitWriter *)
                                             CONCAT44(in_stack_ffffffffffffff84,
                                                      in_stack_ffffffffffffff80),
                                             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                                             (VP8LBackwardRefs *)
                                             CONCAT44(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70),
                                             (uint16_t *)
                                             CONCAT44(in_stack_ffffffffffffff6c,
                                                      in_stack_ffffffffffffff68),
                                             in_stack_ffffffffffffff60);
            }
          }
        }
      }
    }
  }
  WebPSafeFree((void *)0x182e25);
  WebPSafeFree((void *)0x182e2f);
  VP8LFreeHistogramSet((VP8LHistogramSet *)0x182e39);
  WebPSafeFree((void *)0x182e43);
  return local_3c;
}

Assistant:

static WebPEncodingError EncodeImageNoHuffman(
    VP8LBitWriter* const bw, const uint32_t* const argb,
    VP8LHashChain* const hash_chain, VP8LBackwardRefs* const refs_array,
    int width, int height, int quality, int low_effort) {
  int i;
  int max_tokens = 0;
  WebPEncodingError err = VP8_ENC_OK;
  VP8LBackwardRefs* refs;
  HuffmanTreeToken* tokens = NULL;
  HuffmanTreeCode huffman_codes[5] = { { 0, NULL, NULL } };
  const uint16_t histogram_symbols[1] = { 0 };    // only one tree, one symbol
  int cache_bits = 0;
  VP8LHistogramSet* histogram_image = NULL;
  HuffmanTree* const huff_tree = (HuffmanTree*)WebPSafeMalloc(
        3ULL * CODE_LENGTH_CODES, sizeof(*huff_tree));
  if (huff_tree == NULL) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  // Calculate backward references from ARGB image.
  if (!VP8LHashChainFill(hash_chain, quality, argb, width, height,
                         low_effort)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }
  err = VP8LGetBackwardReferences(
      width, height, argb, quality, /*low_effort=*/0, kLZ77Standard | kLZ77RLE,
      cache_bits, /*do_no_cache=*/0, hash_chain, refs_array, &cache_bits);
  if (err != VP8_ENC_OK) goto Error;
  refs = &refs_array[0];
  histogram_image = VP8LAllocateHistogramSet(1, cache_bits);
  if (histogram_image == NULL) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }
  VP8LHistogramSetClear(histogram_image);

  // Build histogram image and symbols from backward references.
  VP8LHistogramStoreRefs(refs, histogram_image->histograms[0]);

  // Create Huffman bit lengths and codes for each histogram image.
  assert(histogram_image->size == 1);
  if (!GetHuffBitLengthsAndCodes(histogram_image, huffman_codes)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  // No color cache, no Huffman image.
  VP8LPutBits(bw, 0, 1);

  // Find maximum number of symbols for the huffman tree-set.
  for (i = 0; i < 5; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[i];
    if (max_tokens < codes->num_symbols) {
      max_tokens = codes->num_symbols;
    }
  }

  tokens = (HuffmanTreeToken*)WebPSafeMalloc(max_tokens, sizeof(*tokens));
  if (tokens == NULL) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  // Store Huffman codes.
  for (i = 0; i < 5; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[i];
    StoreHuffmanCode(bw, huff_tree, tokens, codes);
    ClearHuffmanTreeIfOnlyOneSymbol(codes);
  }

  // Store actual literals.
  err = StoreImageToBitMask(bw, width, 0, refs, histogram_symbols,
                            huffman_codes);

 Error:
  WebPSafeFree(tokens);
  WebPSafeFree(huff_tree);
  VP8LFreeHistogramSet(histogram_image);
  WebPSafeFree(huffman_codes[0].codes);
  return err;
}